

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManFlowLabelTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  
  while( true ) {
    if ((pObj->TravId == p->nTravIds) ||
       (pObj->TravId = p->nTravIds, (*(uint *)&pObj->field_0x18 & 7) == 2)) {
      return;
    }
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 != 0) {
      return;
    }
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) break;
    Llb_ManFlowLabelTfi_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                ,0x265,"void Llb_ManFlowLabelTfi_rec(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Llb_ManFlowLabelTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowLabelTfi_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManFlowLabelTfi_rec( p, Aig_ObjFanin1(pObj) );
}